

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O0

Bbr_ImageNode_t **
Bbr_CreateNodes(DdManager *dd,int nParts,Bbr_ImagePart_t **pParts,int nVars,Bbr_ImageVar_t **pVars)

{
  DdHalfWord DVar1;
  DdNode *pDVar2;
  int iVar3;
  Bbr_ImageNode_t **ppBVar4;
  Bbr_ImageNode_t *pBVar5;
  DdNode *pDVar6;
  int local_50;
  int iPart;
  int v;
  int i;
  DdNode *bTemp;
  Bbr_ImageNode_t *pNode;
  Bbr_ImageNode_t **pNodes;
  Bbr_ImageVar_t **pVars_local;
  int nVars_local;
  Bbr_ImagePart_t **pParts_local;
  int nParts_local;
  DdManager *dd_local;
  
  ppBVar4 = (Bbr_ImageNode_t **)malloc((long)nParts << 3);
  for (iPart = 0; iPart < nParts; iPart = iPart + 1) {
    pBVar5 = (Bbr_ImageNode_t *)malloc(0x30);
    ppBVar4[iPart] = pBVar5;
    memset(ppBVar4[iPart],0,0x30);
    ppBVar4[iPart]->dd = dd;
    ppBVar4[iPart]->pPart = pParts[iPart];
  }
  local_50 = 0;
  do {
    if (nVars <= local_50) {
      for (iPart = 0; iPart < nParts; iPart = iPart + 1) {
        pBVar5 = ppBVar4[iPart];
        if (pBVar5->bCube != (DdNode *)0x0) {
          pDVar2 = pParts[iPart]->bFunc;
          pDVar6 = Cudd_bddExistAbstract(dd,pDVar2,pBVar5->bCube);
          pParts[iPart]->bFunc = pDVar6;
          Cudd_Ref(pParts[iPart]->bFunc);
          Cudd_RecursiveDeref(dd,pDVar2);
          pDVar2 = pParts[iPart]->bSupp;
          pDVar6 = Cudd_bddExistAbstract(dd,pDVar2,pBVar5->bCube);
          pParts[iPart]->bSupp = pDVar6;
          Cudd_Ref(pParts[iPart]->bSupp);
          Cudd_RecursiveDeref(dd,pDVar2);
          iVar3 = Cudd_SupportSize(dd,pParts[iPart]->bSupp);
          pParts[iPart]->nSupp = (short)iVar3;
          iVar3 = Cudd_DagSize(pParts[iPart]->bFunc);
          pParts[iPart]->nNodes = iVar3;
          if (iPart < nParts + -1) {
            Cudd_RecursiveDeref(dd,pBVar5->bCube);
            pBVar5->bCube = (DdNode *)0x0;
          }
        }
        pBVar5->bImage = pParts[iPart]->bFunc;
        Cudd_Ref(pBVar5->bImage);
      }
      return ppBVar4;
    }
    if (pVars[local_50] != (Bbr_ImageVar_t *)0x0) {
      if (pVars[local_50]->nParts < 1) {
        __assert_fail("pVars[v]->nParts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                      ,0x21a,
                      "Bbr_ImageNode_t **Bbr_CreateNodes(DdManager *, int, Bbr_ImagePart_t **, int, Bbr_ImageVar_t **)"
                     );
      }
      if (pVars[local_50]->nParts < 2) {
        DVar1 = pVars[local_50]->bParts->index;
        if (ppBVar4[(int)DVar1]->bCube == (DdNode *)0x0) {
          ppBVar4[(int)DVar1]->bCube = dd->vars[local_50];
          Cudd_Ref(dd->vars[local_50]);
        }
        else {
          pDVar2 = ppBVar4[(int)DVar1]->bCube;
          pDVar6 = Cudd_bddAnd(dd,pDVar2,dd->vars[local_50]);
          ppBVar4[(int)DVar1]->bCube = pDVar6;
          Cudd_Ref(ppBVar4[(int)DVar1]->bCube);
          Cudd_RecursiveDeref(dd,pDVar2);
        }
        Cudd_RecursiveDeref(dd,pVars[local_50]->bParts);
        if (pVars[local_50] != (Bbr_ImageVar_t *)0x0) {
          free(pVars[local_50]);
          pVars[local_50] = (Bbr_ImageVar_t *)0x0;
        }
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

Bbr_ImageNode_t ** Bbr_CreateNodes( DdManager * dd, 
    int nParts, Bbr_ImagePart_t ** pParts, 
    int nVars,  Bbr_ImageVar_t ** pVars )
{
    Bbr_ImageNode_t ** pNodes;
    Bbr_ImageNode_t * pNode;
    DdNode * bTemp;
    int i, v, iPart;
/*
    DdManager *         dd;       // the manager 
    DdNode *            bCube;    // the cube to quantify
    DdNode *            bImage;   // the partial image
    Bbr_ImageNode_t * pNode1;   // the first branch
    Bbr_ImageNode_t * pNode2;   // the second branch
    Bbr_ImagePart_t * pPart;    // the partition (temporary)
*/
    // start the partitions
    pNodes = ABC_ALLOC( Bbr_ImageNode_t *, nParts );
    // create structures for each leaf nodes
    for ( i = 0; i < nParts; i++ )
    {
        pNodes[i] = ABC_ALLOC( Bbr_ImageNode_t, 1 );
        memset( pNodes[i], 0, sizeof(Bbr_ImageNode_t) );
        pNodes[i]->dd    = dd;
        pNodes[i]->pPart = pParts[i];
    }
    // find the quantification cubes for each leaf node
    for ( v = 0; v < nVars; v++ )
    {
        if ( pVars[v] == NULL )
            continue;
        assert( pVars[v]->nParts > 0 );
        if ( pVars[v]->nParts > 1 )
            continue;
        iPart = pVars[v]->bParts->index;
        if ( pNodes[iPart]->bCube == NULL )
        {
            pNodes[iPart]->bCube = dd->vars[v];   
            Cudd_Ref( dd->vars[v] );
        }
        else
        {
            pNodes[iPart]->bCube = Cudd_bddAnd( dd, bTemp = pNodes[iPart]->bCube, dd->vars[v] );  
            Cudd_Ref( pNodes[iPart]->bCube );
            Cudd_RecursiveDeref( dd, bTemp );
        }
        // remove these  variables
        Cudd_RecursiveDeref( dd, pVars[v]->bParts );
        ABC_FREE( pVars[v] );
    }

    // assign the leaf node images
    for ( i = 0; i < nParts; i++ )
    {
        pNode = pNodes[i];
        if ( pNode->bCube )
        {
            // update the partition
            pParts[i]->bFunc = Cudd_bddExistAbstract( dd, bTemp = pParts[i]->bFunc, pNode->bCube );
            Cudd_Ref( pParts[i]->bFunc );
            Cudd_RecursiveDeref( dd, bTemp );
            // update the support the partition
            pParts[i]->bSupp = Cudd_bddExistAbstract( dd, bTemp = pParts[i]->bSupp, pNode->bCube ); 
            Cudd_Ref( pParts[i]->bSupp );
            Cudd_RecursiveDeref( dd, bTemp );
            // update the numbers
            pParts[i]->nSupp  = Cudd_SupportSize( dd, pParts[i]->bSupp );
            pParts[i]->nNodes = Cudd_DagSize( pParts[i]->bFunc );
            // get rid of the cube
            // save the last (care set) quantification cube
            if ( i < nParts - 1 )
            {
                Cudd_RecursiveDeref( dd, pNode->bCube );
                pNode->bCube = NULL;
            }
        }
        // copy the function
        pNode->bImage = pParts[i]->bFunc;   Cudd_Ref( pNode->bImage );
    }
/*
    for ( i = 0; i < nParts; i++ )
    {
        pNode = pNodes[i];
ABC_PRB( dd, pNode->bCube );
ABC_PRB( dd, pNode->pPart->bFunc );
ABC_PRB( dd, pNode->pPart->bSupp );
printf( "\n" );
    }
*/
    return pNodes;
}